

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O0

uc_err uc_context_reg_read_batch(uc_context *ctx,int *regs,void **vals,int count)

{
  uc_err uVar1;
  undefined8 uStack_70;
  uc_err err;
  size_t size;
  void *value;
  int local_58;
  uint regid;
  int i;
  int mode;
  void *env;
  code *local_38;
  reg_read_t reg_read;
  void **ppvStack_28;
  int count_local;
  void **vals_local;
  int *regs_local;
  uc_context *ctx_local;
  
  reg_read._4_4_ = count;
  ppvStack_28 = vals;
  vals_local = (void **)regs;
  regs_local = (int *)ctx;
  _env = find_context_reg_rw(ctx->arch,ctx->mode);
  local_38 = (code *)env;
  _i = regs_local + 5;
  regid = regs_local[2];
  local_58 = 0;
  while( true ) {
    if (reg_read._4_4_ <= local_58) {
      return UC_ERR_OK;
    }
    value._4_4_ = *(undefined4 *)((long)vals_local + (long)local_58 * 4);
    size = (size_t)ppvStack_28[local_58];
    uStack_70 = 0xffffffffffffffff;
    uVar1 = (*local_38)(_i,regid,value._4_4_,size,&stack0xffffffffffffff90);
    if (uVar1 != UC_ERR_OK) break;
    local_58 = local_58 + 1;
  }
  return uVar1;
}

Assistant:

UNICORN_EXPORT
uc_err uc_context_reg_read_batch(uc_context *ctx, int *regs, void **vals,
                                 int count)
{
    reg_read_t reg_read = find_context_reg_rw(ctx->arch, ctx->mode).read;
    void *env = ctx->data;
    int mode = ctx->mode;
    int i;

    for (i = 0; i < count; i++) {
        unsigned int regid = regs[i];
        void *value = vals[i];
        size_t size = (size_t)-1;
        uc_err err = reg_read(env, mode, regid, value, &size);
        if (err) {
            return err;
        }
    }

    return UC_ERR_OK;
}